

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::SetSuppressDevWarnings(cmake *this,bool b)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  string value;
  string local_58;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = 0;
  pcVar1 = "FALSE";
  if ((int)CONCAT71(in_register_00000031,b) != 0) {
    pcVar1 = "TRUE";
  }
  local_38 = &local_28;
  std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,(ulong)pcVar1);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
  AddCacheEntry(this,&local_58,(string *)&local_38,
                "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

void cmake::SetSuppressDevWarnings(bool b)
{
  std::string value;

  // equivalent to -Wno-dev
  if (b) {
    value = "TRUE";
  }
  // equivalent to -Wdev
  else {
    value = "FALSE";
  }

  this->AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", value,
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmStateEnums::INTERNAL);
}